

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

PivotColumn *
duckdb::PivotColumn::Deserialize(PivotColumn *__return_storage_ptr__,Deserializer *deserializer)

{
  pointer *ppPVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  __tmp;
  vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_> local_68;
  vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_> local_48;
  
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pivot_enum)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pivot_enum).field_2;
  (__return_storage_ptr__->pivot_enum)._M_string_length = 0;
  (__return_storage_ptr__->pivot_enum).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->subquery).
  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"pivot_expressions");
  if ((char)uVar2 == '\0') {
    local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = *(undefined4 *)
             &(__return_storage_ptr__->pivot_expressions).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined4 *)
             ((long)&(__return_storage_ptr__->pivot_expressions).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar5 = *(undefined4 *)
             &(__return_storage_ptr__->pivot_expressions).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = *(undefined4 *)
             ((long)&(__return_storage_ptr__->pivot_expressions).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(__return_storage_ptr__->pivot_expressions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((type *)&local_48,deserializer);
    uVar3 = *(undefined4 *)
             &(__return_storage_ptr__->pivot_expressions).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined4 *)
             ((long)&(__return_storage_ptr__->pivot_expressions).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar5 = *(undefined4 *)
             &(__return_storage_ptr__->pivot_expressions).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = *(undefined4 *)
             ((long)&(__return_storage_ptr__->pivot_expressions).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(__return_storage_ptr__->pivot_expressions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_48.
                super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_48.
                super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_48.
                super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar4,uVar3);
  local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(uVar6,uVar5);
  local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&local_68);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&local_48);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x65,"unpivot_names",&__return_storage_ptr__->unpivot_names);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"entries");
  if ((char)uVar2 == '\0') {
    local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = *(undefined4 *)
             &(__return_storage_ptr__->entries).
              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined4 *)
             ((long)&(__return_storage_ptr__->entries).
                     super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     .
                     super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar5 = *(undefined4 *)
             &(__return_storage_ptr__->entries).
              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = *(undefined4 *)
             ((long)&(__return_storage_ptr__->entries).
                     super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     .
                     super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->entries).
         super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
         super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::PivotColumnEntry,true>>
              ((type *)&local_48,deserializer);
    uVar3 = *(undefined4 *)
             &(__return_storage_ptr__->entries).
              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined4 *)
             ((long)&(__return_storage_ptr__->entries).
                     super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     .
                     super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar5 = *(undefined4 *)
             &(__return_storage_ptr__->entries).
              super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
              super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = *(undefined4 *)
             ((long)&(__return_storage_ptr__->entries).
                     super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     .
                     super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (__return_storage_ptr__->entries).
         super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
         super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(uVar4,uVar3);
  local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(uVar6,uVar5);
  local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::~vector
            (&local_68);
  ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::~vector
            (&local_48);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"pivot_enum");
  if ((char)uVar2 == '\0') {
    ppPVar1 = &local_68.
               super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)local_68.
                          super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    local_68.super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppPVar1;
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pivot_enum,(string *)&local_68);
    if (local_68.
        super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)ppPVar1) goto LAB_005c9319;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_68,deserializer);
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pivot_enum,(string *)&local_68);
    if (local_68.
        super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pointer)&local_68.
                  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_005c9319;
  }
  operator_delete(local_68.
                  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start);
LAB_005c9319:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  return __return_storage_ptr__;
}

Assistant:

PivotColumn PivotColumn::Deserialize(Deserializer &deserializer) {
	PivotColumn result;
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(100, "pivot_expressions", result.pivot_expressions);
	deserializer.ReadPropertyWithDefault<vector<string>>(101, "unpivot_names", result.unpivot_names);
	deserializer.ReadPropertyWithDefault<vector<PivotColumnEntry>>(102, "entries", result.entries);
	deserializer.ReadPropertyWithDefault<string>(103, "pivot_enum", result.pivot_enum);
	return result;
}